

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O2

RK_U32 __thiscall MppBufferService::get_group_id(MppBufferService *this)

{
  RK_U32 RVar1;
  MppBufferGroupImpl *pMVar2;
  RK_U32 id;
  
  id = this->group_id;
  RVar1 = id;
  if (get_group_id()::overflowed == '\0') {
    if (id != 0) {
      this->group_id = id + 1;
      goto LAB_00131ef9;
    }
    get_group_id()::overflowed = '\x01';
    RVar1 = 1;
  }
  do {
    id = RVar1;
    this->group_id = id + 1;
    pMVar2 = get_group_by_id(this,id);
    RVar1 = id + 1;
  } while (pMVar2 != (MppBufferGroupImpl *)0x0);
LAB_00131ef9:
  this->group_count = this->group_count + 1;
  return id;
}

Assistant:

RK_U32 MppBufferService::get_group_id()
{
    RK_U32 id = 0;
    static RK_U32 overflowed = 0;

    if (!overflowed) {
        /* avoid 0 group id */
        if (group_id)
            id = group_id++;
        else {
            overflowed = 1;
            group_id = 1;
        }
    }

    if (overflowed) {
        id = group_id++;

        /* when it is overflow avoid the used id */
        while (get_group_by_id(id))
            id = group_id++;
    }

    group_count++;

    return id;
}